

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O3

void __thiscall
OpenMD::EAMInteractionType::EAMInteractionType
          (EAMInteractionType *this,RealType re,RealType alpha,RealType beta,RealType A,RealType B,
          RealType kappa,RealType lambda)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__EAMInteractionType_002f9920;
  (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->phi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->interactionType_ = eamitZhou;
  NonBondedInteractionType::setEAMZhou(&this->super_NonBondedInteractionType);
  this->re_ = re;
  this->alpha_ = alpha;
  this->beta_ = beta;
  this->A_ = A;
  this->B_ = B;
  this->kappa_ = kappa;
  this->lambda_ = lambda;
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType beta, RealType A,
                       RealType B, RealType kappa, RealType lambda) {
      interactionType_ = eamitZhou;
      setEAMZhou();
      re_     = re;
      alpha_  = alpha;
      beta_   = beta;
      A_      = A;
      B_      = B;
      kappa_  = kappa;
      lambda_ = lambda;
    }